

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O3

void pack_txb_tokens(aom_writer *w,AV1_COMMON *cm,MACROBLOCK *x,TokenExtra **tp,TokenExtra *tok_end,
                    MACROBLOCKD *xd,MB_MODE_INFO *mbmi,int plane,BLOCK_SIZE plane_bsize,
                    aom_bit_depth_t bit_depth,int block,int blk_row,int blk_col,TX_SIZE tx_size,
                    TOKEN_STATS *token_stats)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  MB_MODE_INFO *mbmi_00;
  undefined3 in_stack_00000019;
  undefined8 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff88;
  int iVar11;
  
  mbmi_00 = (MB_MODE_INFO *)((ulong)mbmi & 0xff);
  bVar1 = (byte)mbmi_00[0x70c6].palette_mode_info.palette_colors[0x11];
  uVar3 = (uint)bVar1;
  iVar9 = (int)xd;
  if (*(int *)(tp + 0x3e0) < 0) {
    uVar3 = (uint)bVar1 +
            (*(int *)(tp + 0x3e0) >> (*(char *)(tp + (long)iVar9 * 0x146 + 3) + 3U & 0x1f));
  }
  bVar1 = (byte)mbmi_00[0x70c6].palette_mode_info.palette_colors[1];
  uVar6 = (uint)bVar1;
  if (*(int *)(tp + 0x3df) < 0) {
    uVar6 = (uint)bVar1 +
            (*(int *)(tp + 0x3df) >> (*(char *)((long)tp + (long)iVar9 * 0xa30 + 0x14) + 3U & 0x1f))
    ;
  }
  iVar4 = ((int)uVar3 >> 2) - _plane_bsize;
  if ((iVar4 != 0 && _plane_bsize <= (int)uVar3 >> 2) &&
     (iVar7 = ((int)uVar6 >> 2) - bit_depth, iVar7 != 0 && (int)bit_depth <= (int)uVar6 >> 2)) {
    if ((iVar9 == 0) &&
       (tok_end[(long)(((int)bit_depth >> (mbmi_00[0x70c7].inter_tx_size[0xe] & 0x1f)) +
                      ((_plane_bsize >> (mbmi_00[0x70c8].ref_frame[0] & 0x1fU)) <<
                      ((byte)mbmi_00[0x70c8].wm_params.wmmat[5] & 0x1f))) + 0x92] != block._0_1_)) {
      uVar10 = (ulong)((block & 0xffU) * 4);
      iVar9 = *(int *)((long)tx_size_high_unit + uVar10);
      if (iVar9 < iVar4) {
        iVar4 = iVar9;
      }
      iVar9 = *(int *)((long)tx_size_wide_unit + uVar10);
      if (iVar9 < iVar7) {
        iVar7 = iVar9;
      }
      if (0 < iVar4) {
        bVar1 = ""[(byte)block._0_1_];
        iVar9 = tx_size_wide_unit[bVar1];
        iVar11 = tx_size_high_unit[bVar1];
        iVar2 = iVar11 * iVar9;
        iVar8 = 0;
        do {
          if (0 < iVar7) {
            iVar5 = 0;
            do {
              pack_txb_tokens(w,cm,x,tp,tok_end,(MACROBLOCKD *)0x0,mbmi_00,plane,
                              (char)iVar8 + plane_bsize,iVar5 + bit_depth,(uint)bVar1,
                              (int)in_stack_ffffffffffffff80,in_stack_ffffffffffffff88,
                              (TX_SIZE)iVar11,(TOKEN_STATS *)CONCAT44(iVar9,iVar2));
              plane = plane + iVar2;
              iVar5 = iVar5 + iVar9;
            } while (iVar5 < iVar7);
          }
          iVar8 = iVar8 + iVar11;
        } while (iVar8 < iVar4);
      }
    }
    else {
      av1_write_coeffs_txb(cm,x,w,_plane_bsize,bit_depth,iVar9,plane,(TX_SIZE)block._0_1_);
    }
  }
  return;
}

Assistant:

static inline void pack_txb_tokens(
    aom_writer *w, AV1_COMMON *cm, MACROBLOCK *const x, const TokenExtra **tp,
    const TokenExtra *const tok_end, MACROBLOCKD *xd, MB_MODE_INFO *mbmi,
    int plane, BLOCK_SIZE plane_bsize, aom_bit_depth_t bit_depth, int block,
    int blk_row, int blk_col, TX_SIZE tx_size, TOKEN_STATS *token_stats) {
  const int max_blocks_high = max_block_high(xd, plane_bsize, plane);
  const int max_blocks_wide = max_block_wide(xd, plane_bsize, plane);

  if (blk_row >= max_blocks_high || blk_col >= max_blocks_wide) return;

  const struct macroblockd_plane *const pd = &xd->plane[plane];
  const TX_SIZE plane_tx_size =
      plane ? av1_get_max_uv_txsize(mbmi->bsize, pd->subsampling_x,
                                    pd->subsampling_y)
            : mbmi->inter_tx_size[av1_get_txb_size_index(plane_bsize, blk_row,
                                                         blk_col)];

  if (tx_size == plane_tx_size || plane) {
    av1_write_coeffs_txb(cm, x, w, blk_row, blk_col, plane, block, tx_size);
#if CONFIG_RD_DEBUG
    TOKEN_STATS tmp_token_stats;
    init_token_stats(&tmp_token_stats);
    token_stats->cost += tmp_token_stats.cost;
#endif
  } else {
    const TX_SIZE sub_txs = sub_tx_size_map[tx_size];
    const int bsw = tx_size_wide_unit[sub_txs];
    const int bsh = tx_size_high_unit[sub_txs];
    const int step = bsh * bsw;
    const int row_end =
        AOMMIN(tx_size_high_unit[tx_size], max_blocks_high - blk_row);
    const int col_end =
        AOMMIN(tx_size_wide_unit[tx_size], max_blocks_wide - blk_col);

    assert(bsw > 0 && bsh > 0);

    for (int r = 0; r < row_end; r += bsh) {
      const int offsetr = blk_row + r;
      for (int c = 0; c < col_end; c += bsw) {
        const int offsetc = blk_col + c;
        pack_txb_tokens(w, cm, x, tp, tok_end, xd, mbmi, plane, plane_bsize,
                        bit_depth, block, offsetr, offsetc, sub_txs,
                        token_stats);
        block += step;
      }
    }
  }
}